

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::keyValueDisplayName
          (LocaleDisplayNamesImpl *this,char *key,char *value,UnicodeString *result,UBool skipAdjust
          )

{
  int iVar1;
  char16_t *currency;
  char *locale;
  UChar *srcChars;
  UBool isChoice;
  UErrorCode sts;
  int32_t len;
  UnicodeString ustrValue;
  
  iVar1 = strcmp(key,"currency");
  if (iVar1 != 0) {
    if ((this->nameLength != UDISPCTX_LENGTH_SHORT) ||
       (ICUDataTable::get(&this->langData,"Types%short",key,value,result),
       (undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) !=
       (undefined1  [56])0x0)) {
      ICUDataTable::get(&this->langData,"Types",key,value,result);
    }
    if (skipAdjust == '\0') {
      adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
    }
    return result;
  }
  sts = U_ZERO_ERROR;
  UnicodeString::UnicodeString(&ustrValue,value,-1,kInvariant);
  isChoice = '\0';
  currency = UnicodeString::getTerminatedBuffer(&ustrValue);
  locale = Locale::getBaseName(&this->locale);
  srcChars = ucurr_getName_63(currency,locale,UCURR_LONG_NAME,&isChoice,&len,&sts);
  if (sts < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::setTo(result,srcChars,len);
    if (skipAdjust == '\0') {
      adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
    }
  }
  else {
    UnicodeString::operator=(result,&ustrValue);
  }
  UnicodeString::~UnicodeString(&ustrValue);
  return result;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::keyValueDisplayName(const char* key,
                                            const char* value,
                                            UnicodeString& result,
                                            UBool skipAdjust) const {
    if (uprv_strcmp(key, "currency") == 0) {
        // ICU4C does not have ICU4J CurrencyDisplayInfo equivalent for now.
        UErrorCode sts = U_ZERO_ERROR;
        UnicodeString ustrValue(value, -1, US_INV);
        int32_t len;
        UBool isChoice = FALSE;
        const UChar *currencyName = ucurr_getName(ustrValue.getTerminatedBuffer(),
            locale.getBaseName(), UCURR_LONG_NAME, &isChoice, &len, &sts);
        if (U_FAILURE(sts)) {
            // Return the value as is on failure
            result = ustrValue;
            return result;
        }
        result.setTo(currencyName, len);
        return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
    }

    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Types%short", key, value, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
        }
    }
    langData.get("Types", key, value, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
}